

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t icu_63::appendUTF8(UChar *s,int32_t length,uint8_t *t,int32_t capacity)

{
  UBool UVar1;
  int32_t local_34;
  UErrorCode local_30;
  int32_t length8;
  UErrorCode errorCode;
  int32_t capacity_local;
  uint8_t *t_local;
  UChar *pUStack_18;
  int32_t length_local;
  UChar *s_local;
  
  local_30 = U_ZERO_ERROR;
  local_34 = 0;
  length8 = capacity;
  _errorCode = t;
  t_local._4_4_ = length;
  pUStack_18 = s;
  u_strToUTF8_63((char *)t,capacity,&local_34,s,length,&local_30);
  UVar1 = ::U_SUCCESS(local_30);
  if (UVar1 == '\0') {
    s_local._4_4_ = 0;
  }
  else {
    s_local._4_4_ = local_34;
  }
  return s_local._4_4_;
}

Assistant:

static int32_t
appendUTF8(const UChar *s, int32_t length, uint8_t *t, int32_t capacity) {
    UErrorCode errorCode=U_ZERO_ERROR;
    int32_t length8=0;
    u_strToUTF8((char *)t, capacity, &length8, s, length, &errorCode);
    if(U_SUCCESS(errorCode)) {
        return length8;
    } else {
        // The string contains an unpaired surrogate.
        // Ignore this string.
        return 0;
    }
}